

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

void la_miam_core_format_text(la_vstring *vstr,void *data,int indent)

{
  uint in_EDX;
  la_vstring *in_RSI;
  la_vstring *in_RDI;
  la_miam_core_pdu *pdu;
  int in_stack_ffffffffffffffe8;
  
  if (((ulong)in_RSI->str & 0xffff) == 0) {
    la_vstring_append_sprintf
              (in_RDI,"%*sMIAM CORE %s, version %u:\n",(ulong)in_EDX,"",
               la_miam_core_format_text::la_miam_core_pdu_type_names[(uint)in_RSI->len],
               (ulong)*(byte *)((long)&in_RSI->str + 4));
  }
  else {
    la_miam_errors_format_text(in_RSI,in_EDX,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void la_miam_core_format_text(la_vstring *vstr, void const *data, int indent) {
	static char const *la_miam_core_pdu_type_names[] = {
		[LA_MIAM_CORE_PDU_DATA] = "Data",
		[LA_MIAM_CORE_PDU_ACK] = "Ack",
		[LA_MIAM_CORE_PDU_ALO] = "Aloha",
		[LA_MIAM_CORE_PDU_ALR] = "Aloha Reply",
		[LA_MIAM_CORE_PDU_UNKNOWN] = "unknown PDU"
	};

	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_core_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_HDR, indent);
		return;
	}
	la_assert(pdu->pdu_type <= LA_MIAM_CORE_PDU_TYPE_MAX);
	LA_ISPRINTF(vstr, indent, "MIAM CORE %s, version %u:\n",
			la_miam_core_pdu_type_names[pdu->pdu_type], pdu->version);
	indent++;
}